

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_scalar_is_high(secp256k1_scalar *a)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  secp256k1_scalar_verify(a);
  uVar1 = (uint)(a->d[3] >> 0x3f);
  uVar2 = uVar1 ^ 1;
  uVar3 = uVar2;
  if (a->d[2] == 0xffffffffffffffff) {
    uVar3 = 0;
  }
  if (0x5d576e7357a4501c < a->d[1]) {
    uVar2 = 0;
  }
  uVar2 = (uVar2 | uVar3 | a->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar3 = 0;
  if (0xdfe92f46681b20a0 < a->d[0]) {
    uVar3 = uVar2;
  }
  if (0x5d576e7357a4501d < a->d[1]) {
    uVar3 = uVar2;
  }
  return uVar3 | uVar1;
}

Assistant:

static int secp256k1_scalar_is_high(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    SECP256K1_SCALAR_VERIFY(a);

    no |= (a->d[3] < SECP256K1_N_H_3);
    yes |= (a->d[3] > SECP256K1_N_H_3) & ~no;
    no |= (a->d[2] < SECP256K1_N_H_2) & ~yes; /* No need for a > check. */
    no |= (a->d[1] < SECP256K1_N_H_1) & ~yes;
    yes |= (a->d[1] > SECP256K1_N_H_1) & ~no;
    yes |= (a->d[0] > SECP256K1_N_H_0) & ~no;
    return yes;
}